

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

void duckdb::MD5Transform(uint32_t *buf,uint32_t *in)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t *in_local;
  uint32_t *buf_local;
  
  uVar4 = buf[1];
  uVar3 = buf[2];
  uVar2 = buf[3];
  uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + *in + 0xd76aa478 + *buf;
  uVar1 = uVar4 + (uVar1 * 0x80 | uVar1 >> 0x19);
  uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + in[1] + 0xe8c7b756 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x1000 | uVar2 >> 0x14);
  uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + in[2] + 0x242070db + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x20000 | uVar3 >> 0xf);
  uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + in[3] + 0xc1bdceee + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x400000 | uVar4 >> 10);
  uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + in[4] + 0xf57c0faf + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x80 | uVar1 >> 0x19);
  uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + in[5] + 0x4787c62a + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x1000 | uVar2 >> 0x14);
  uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + in[6] + 0xa8304613 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x20000 | uVar3 >> 0xf);
  uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + in[7] + 0xfd469501 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x400000 | uVar4 >> 10);
  uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + in[8] + 0x698098d8 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x80 | uVar1 >> 0x19);
  uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + in[9] + 0x8b44f7af + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x1000 | uVar2 >> 0x14);
  uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + (in[10] - 0xa44f) + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x20000 | uVar3 >> 0xf);
  uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + in[0xb] + 0x895cd7be + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x400000 | uVar4 >> 10);
  uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + in[0xc] + 0x6b901122 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x80 | uVar1 >> 0x19);
  uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + in[0xd] + 0xfd987193 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x1000 | uVar2 >> 0x14);
  uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + in[0xe] + 0xa679438e + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x20000 | uVar3 >> 0xf);
  uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + in[0xf] + 0x49b40821 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x400000 | uVar4 >> 10);
  uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + in[1] + 0xf61e2562 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x20 | uVar1 >> 0x1b);
  uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + in[6] + 0xc040b340 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x200 | uVar2 >> 0x17);
  uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + in[0xb] + 0x265e5a51 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x4000 | uVar3 >> 0x12);
  uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + *in + 0xe9b6c7aa + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x100000 | uVar4 >> 0xc);
  uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + in[5] + 0xd62f105d + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x20 | uVar1 >> 0x1b);
  uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + in[10] + 0x2441453 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x200 | uVar2 >> 0x17);
  uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + in[0xf] + 0xd8a1e681 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x4000 | uVar3 >> 0x12);
  uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + in[4] + 0xe7d3fbc8 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x100000 | uVar4 >> 0xc);
  uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + in[9] + 0x21e1cde6 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x20 | uVar1 >> 0x1b);
  uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + in[0xe] + 0xc33707d6 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x200 | uVar2 >> 0x17);
  uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + in[3] + 0xf4d50d87 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x4000 | uVar3 >> 0x12);
  uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + in[8] + 0x455a14ed + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x100000 | uVar4 >> 0xc);
  uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + in[0xd] + 0xa9e3e905 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x20 | uVar1 >> 0x1b);
  uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + in[2] + 0xfcefa3f8 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x200 | uVar2 >> 0x17);
  uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + in[7] + 0x676f02d9 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x4000 | uVar3 >> 0x12);
  uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + in[0xc] + 0x8d2a4c8a + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x100000 | uVar4 >> 0xc);
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + (in[5] - 0x5c6be) + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x10 | uVar1 >> 0x1c);
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + in[8] + 0x8771f681 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x800 | uVar2 >> 0x15);
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + in[0xb] + 0x6d9d6122 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x10000 | uVar3 >> 0x10);
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + in[0xe] + 0xfde5380c + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x800000 | uVar4 >> 9);
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + in[1] + 0xa4beea44 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x10 | uVar1 >> 0x1c);
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + in[4] + 0x4bdecfa9 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x800 | uVar2 >> 0x15);
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + in[7] + 0xf6bb4b60 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x10000 | uVar3 >> 0x10);
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + in[10] + 0xbebfbc70 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x800000 | uVar4 >> 9);
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + in[0xd] + 0x289b7ec6 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x10 | uVar1 >> 0x1c);
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + *in + 0xeaa127fa + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x800 | uVar2 >> 0x15);
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + in[3] + 0xd4ef3085 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x10000 | uVar3 >> 0x10);
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + in[6] + 0x4881d05 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x800000 | uVar4 >> 9);
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + in[9] + 0xd9d4d039 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x10 | uVar1 >> 0x1c);
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + in[0xc] + 0xe6db99e5 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x800 | uVar2 >> 0x15);
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + in[0xf] + 0x1fa27cf8 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x10000 | uVar3 >> 0x10);
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + in[2] + 0xc4ac5665 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x800000 | uVar4 >> 9);
  uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + *in + 0xf4292244 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x40 | uVar1 >> 0x1a);
  uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + in[7] + 0x432aff97 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x400 | uVar2 >> 0x16);
  uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + in[0xe] + 0xab9423a7 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x8000 | uVar3 >> 0x11);
  uVar4 = (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + in[5] + 0xfc93a039 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x200000 | uVar4 >> 0xb);
  uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + in[0xc] + 0x655b59c3 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x40 | uVar1 >> 0x1a);
  uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + in[3] + 0x8f0ccc92 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x400 | uVar2 >> 0x16);
  uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + (in[10] - 0x100b83) + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x8000 | uVar3 >> 0x11);
  uVar4 = (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + in[1] + 0x85845dd1 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x200000 | uVar4 >> 0xb);
  uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + in[8] + 0x6fa87e4f + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x40 | uVar1 >> 0x1a);
  uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + in[0xf] + 0xfe2ce6e0 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x400 | uVar2 >> 0x16);
  uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + in[6] + 0xa3014314 + uVar3;
  uVar5 = uVar2 + (uVar3 * 0x8000 | uVar3 >> 0x11);
  uVar4 = (uVar2 ^ (uVar5 | uVar1 ^ 0xffffffff)) + in[0xd] + 0x4e0811a1 + uVar4;
  uVar6 = uVar5 + (uVar4 * 0x200000 | uVar4 >> 0xb);
  uVar1 = (uVar5 ^ (uVar6 | uVar2 ^ 0xffffffff)) + in[4] + 0xf7537e82 + uVar1;
  uVar4 = uVar6 + (uVar1 * 0x40 | uVar1 >> 0x1a);
  uVar2 = (uVar6 ^ (uVar4 | uVar5 ^ 0xffffffff)) + in[0xb] + 0xbd3af235 + uVar2;
  uVar3 = uVar4 + (uVar2 * 0x400 | uVar2 >> 0x16);
  uVar5 = (uVar4 ^ (uVar3 | uVar6 ^ 0xffffffff)) + in[2] + 0x2ad7d2bb + uVar5;
  uVar2 = uVar3 + (uVar5 * 0x8000 | uVar5 >> 0x11);
  uVar6 = (uVar3 ^ (uVar2 | uVar4 ^ 0xffffffff)) + in[9] + 0xeb86d391 + uVar6;
  *buf = uVar4 + *buf;
  buf[1] = uVar2 + (uVar6 * 0x200000 | uVar6 >> 0xb) + buf[1];
  buf[2] = uVar2 + buf[2];
  buf[3] = uVar3 + buf[3];
  return;
}

Assistant:

static void MD5Transform(uint32_t buf[4], const uint32_t in[16]) {
	uint32_t a, b, c, d;

	a = buf[0];
	b = buf[1];
	c = buf[2];
	d = buf[3];

	MD5STEP(F1, a, b, c, d, in[0] + 0xd76aa478, 7);
	MD5STEP(F1, d, a, b, c, in[1] + 0xe8c7b756, 12);
	MD5STEP(F1, c, d, a, b, in[2] + 0x242070db, 17);
	MD5STEP(F1, b, c, d, a, in[3] + 0xc1bdceee, 22);
	MD5STEP(F1, a, b, c, d, in[4] + 0xf57c0faf, 7);
	MD5STEP(F1, d, a, b, c, in[5] + 0x4787c62a, 12);
	MD5STEP(F1, c, d, a, b, in[6] + 0xa8304613, 17);
	MD5STEP(F1, b, c, d, a, in[7] + 0xfd469501, 22);
	MD5STEP(F1, a, b, c, d, in[8] + 0x698098d8, 7);
	MD5STEP(F1, d, a, b, c, in[9] + 0x8b44f7af, 12);
	MD5STEP(F1, c, d, a, b, in[10] + 0xffff5bb1, 17);
	MD5STEP(F1, b, c, d, a, in[11] + 0x895cd7be, 22);
	MD5STEP(F1, a, b, c, d, in[12] + 0x6b901122, 7);
	MD5STEP(F1, d, a, b, c, in[13] + 0xfd987193, 12);
	MD5STEP(F1, c, d, a, b, in[14] + 0xa679438e, 17);
	MD5STEP(F1, b, c, d, a, in[15] + 0x49b40821, 22);

	MD5STEP(F2, a, b, c, d, in[1] + 0xf61e2562, 5);
	MD5STEP(F2, d, a, b, c, in[6] + 0xc040b340, 9);
	MD5STEP(F2, c, d, a, b, in[11] + 0x265e5a51, 14);
	MD5STEP(F2, b, c, d, a, in[0] + 0xe9b6c7aa, 20);
	MD5STEP(F2, a, b, c, d, in[5] + 0xd62f105d, 5);
	MD5STEP(F2, d, a, b, c, in[10] + 0x02441453, 9);
	MD5STEP(F2, c, d, a, b, in[15] + 0xd8a1e681, 14);
	MD5STEP(F2, b, c, d, a, in[4] + 0xe7d3fbc8, 20);
	MD5STEP(F2, a, b, c, d, in[9] + 0x21e1cde6, 5);
	MD5STEP(F2, d, a, b, c, in[14] + 0xc33707d6, 9);
	MD5STEP(F2, c, d, a, b, in[3] + 0xf4d50d87, 14);
	MD5STEP(F2, b, c, d, a, in[8] + 0x455a14ed, 20);
	MD5STEP(F2, a, b, c, d, in[13] + 0xa9e3e905, 5);
	MD5STEP(F2, d, a, b, c, in[2] + 0xfcefa3f8, 9);
	MD5STEP(F2, c, d, a, b, in[7] + 0x676f02d9, 14);
	MD5STEP(F2, b, c, d, a, in[12] + 0x8d2a4c8a, 20);

	MD5STEP(F3, a, b, c, d, in[5] + 0xfffa3942, 4);
	MD5STEP(F3, d, a, b, c, in[8] + 0x8771f681, 11);
	MD5STEP(F3, c, d, a, b, in[11] + 0x6d9d6122, 16);
	MD5STEP(F3, b, c, d, a, in[14] + 0xfde5380c, 23);
	MD5STEP(F3, a, b, c, d, in[1] + 0xa4beea44, 4);
	MD5STEP(F3, d, a, b, c, in[4] + 0x4bdecfa9, 11);
	MD5STEP(F3, c, d, a, b, in[7] + 0xf6bb4b60, 16);
	MD5STEP(F3, b, c, d, a, in[10] + 0xbebfbc70, 23);
	MD5STEP(F3, a, b, c, d, in[13] + 0x289b7ec6, 4);
	MD5STEP(F3, d, a, b, c, in[0] + 0xeaa127fa, 11);
	MD5STEP(F3, c, d, a, b, in[3] + 0xd4ef3085, 16);
	MD5STEP(F3, b, c, d, a, in[6] + 0x04881d05, 23);
	MD5STEP(F3, a, b, c, d, in[9] + 0xd9d4d039, 4);
	MD5STEP(F3, d, a, b, c, in[12] + 0xe6db99e5, 11);
	MD5STEP(F3, c, d, a, b, in[15] + 0x1fa27cf8, 16);
	MD5STEP(F3, b, c, d, a, in[2] + 0xc4ac5665, 23);

	MD5STEP(F4, a, b, c, d, in[0] + 0xf4292244, 6);
	MD5STEP(F4, d, a, b, c, in[7] + 0x432aff97, 10);
	MD5STEP(F4, c, d, a, b, in[14] + 0xab9423a7, 15);
	MD5STEP(F4, b, c, d, a, in[5] + 0xfc93a039, 21);
	MD5STEP(F4, a, b, c, d, in[12] + 0x655b59c3, 6);
	MD5STEP(F4, d, a, b, c, in[3] + 0x8f0ccc92, 10);
	MD5STEP(F4, c, d, a, b, in[10] + 0xffeff47d, 15);
	MD5STEP(F4, b, c, d, a, in[1] + 0x85845dd1, 21);
	MD5STEP(F4, a, b, c, d, in[8] + 0x6fa87e4f, 6);
	MD5STEP(F4, d, a, b, c, in[15] + 0xfe2ce6e0, 10);
	MD5STEP(F4, c, d, a, b, in[6] + 0xa3014314, 15);
	MD5STEP(F4, b, c, d, a, in[13] + 0x4e0811a1, 21);
	MD5STEP(F4, a, b, c, d, in[4] + 0xf7537e82, 6);
	MD5STEP(F4, d, a, b, c, in[11] + 0xbd3af235, 10);
	MD5STEP(F4, c, d, a, b, in[2] + 0x2ad7d2bb, 15);
	MD5STEP(F4, b, c, d, a, in[9] + 0xeb86d391, 21);

	buf[0] += a;
	buf[1] += b;
	buf[2] += c;
	buf[3] += d;
}